

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 floatx80_div_sparc(floatx80 a,floatx80 b,float_status *status)

{
  undefined1 auVar1 [12];
  ushort uVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ulong unaff_RBP;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint32_t aLow;
  ulong uVar16;
  uint uVar17;
  bool bVar18;
  floatx80 fVar19;
  
  uVar10 = a.low;
  uVar16 = b.low;
  uVar2 = a.high & 0x7fff;
  if ((long)uVar10 < 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)
  {
    uVar14 = b._8_4_;
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 ||
        (long)uVar16 < 0) {
      uVar17 = (uint)uVar2;
      uVar7 = uVar14 ^ a._8_4_;
      unaff_RBP = (ulong)uVar7;
      if (uVar2 == 0x7fff) {
        if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
          if ((uVar14 & 0x7fff) != 0x7fff) {
LAB_009e32b6:
            uVar16 = (ulong)(uVar7 | 0x7fff);
            uVar3 = 0x8000000000000000;
            goto LAB_009e3121;
          }
          if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0)
          goto LAB_009e310e;
        }
LAB_009e3193:
        fVar19 = propagateFloatx80NaN_sparc(a,b,status);
        auVar1 = fVar19._0_12_;
      }
      else {
        if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) {
          uVar14 = uVar14 & 0x7fff;
          if (uVar14 != 0x7fff) goto LAB_009e31c0;
          if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0)
          goto LAB_009e3193;
LAB_009e3280:
          uVar16 = (ulong)(uVar7 & 0x8000);
          uVar3 = 0;
          goto LAB_009e3121;
        }
        if (uVar16 == 0) {
          if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 ||
              uVar10 != 0) {
            status->float_exception_flags = status->float_exception_flags | 4;
            goto LAB_009e32b6;
          }
          goto LAB_009e310e;
        }
        uVar12 = 0x3f;
        if (uVar16 != 0) {
          for (; uVar16 >> uVar12 == 0; uVar12 = uVar12 - 1) {
          }
        }
        uVar16 = uVar16 << ((byte)(uVar12 ^ 0x3f) & 0x3f);
        uVar14 = 1 - (int)(uVar12 ^ 0x3f);
LAB_009e31c0:
        if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
          if (uVar10 == 0) goto LAB_009e3280;
          uVar12 = 0x3f;
          if (uVar10 != 0) {
            for (; uVar10 >> uVar12 == 0; uVar12 = uVar12 - 1) {
            }
          }
          uVar10 = uVar10 << ((byte)(uVar12 ^ 0x3f) & 0x3f);
          uVar17 = 1 - (int)(uVar12 ^ 0x3f);
        }
        uVar12 = 0;
        if (uVar16 <= uVar10) {
          uVar12 = uVar10 << 0x3f;
        }
        uVar11 = uVar10 >> (uVar16 <= uVar10);
        uVar5 = 0xffffffffffffffff;
        if (uVar11 < uVar16) {
          uVar8 = uVar16 >> 0x20;
          uVar13 = 0xffffffff00000000;
          if (uVar11 < (uVar16 & 0xffffffff00000000)) {
            uVar13 = uVar11 / uVar8 << 0x20;
          }
          uVar15 = (uVar16 & 0xffffffff) * (uVar13 >> 0x20);
          uVar4 = uVar13 * uVar16;
          uVar5 = uVar12 - uVar4;
          lVar6 = ((uVar11 - ((uVar15 >> 0x20) + (uVar13 >> 0x20) * uVar8)) -
                  (ulong)(uVar12 < uVar4)) - (ulong)(uVar4 < uVar15 << 0x20);
          if (lVar6 < 0) {
            uVar4 = (0x100000000 - uVar13) * uVar16 + uVar12;
            uVar15 = uVar5;
            do {
              uVar13 = uVar13 - 0x100000000;
              uVar5 = uVar15 + (uVar16 << 0x20);
              bVar18 = uVar4 < uVar15;
              uVar4 = uVar4 + (uVar16 << 0x20);
              lVar6 = lVar6 + uVar8 + (ulong)bVar18;
              uVar15 = uVar5;
            } while (lVar6 < 0);
          }
          uVar4 = uVar5 >> 0x20 | lVar6 << 0x20;
          uVar5 = 0xffffffff;
          if (uVar4 < (uVar16 & 0xffffffff00000000)) {
            uVar5 = uVar4 / uVar8;
          }
          uVar5 = uVar5 | uVar13;
        }
        uVar4 = uVar16 >> 0x20;
        uVar13 = uVar16 & 0xffffffff;
        uVar8 = (uVar5 >> 0x20) * uVar13;
        uVar15 = (uVar5 & 0xffffffff) * uVar4;
        lVar6 = 0;
        uVar9 = uVar15 + uVar8;
        if (CARRY8(uVar15,uVar8)) {
          lVar6 = -0x100000000;
        }
        uVar15 = uVar5 * uVar16;
        uVar8 = uVar12 - uVar15;
        lVar6 = (((uVar11 - (uVar12 < uVar15)) - ((uVar9 >> 0x20) + (uVar5 >> 0x20) * uVar4)) +
                lVar6) - (ulong)(uVar15 < uVar9 << 0x20);
        if (lVar6 < 0) {
          uVar12 = uVar12 + (1 - uVar5) * uVar16;
          uVar11 = uVar8;
          do {
            uVar5 = uVar5 - 1;
            uVar8 = uVar11 + uVar16;
            bVar18 = uVar12 < uVar11;
            uVar12 = uVar12 + uVar16;
            lVar6 = lVar6 + (ulong)bVar18;
            uVar11 = uVar8;
          } while (lVar6 < 0);
        }
        uVar3 = 0xffffffffffffffff;
        if (uVar8 < uVar16) {
          uVar12 = 0xffffffff00000000;
          if (uVar8 < (uVar16 & 0xffffffff00000000)) {
            uVar12 = uVar8 / uVar4 << 0x20;
          }
          uVar9 = (uVar12 >> 0x20) * uVar13;
          uVar15 = uVar12 * uVar16;
          uVar11 = -uVar15;
          lVar6 = ((uVar8 - ((uVar9 >> 0x20) + (uVar12 >> 0x20) * uVar4)) - (ulong)(uVar15 != 0)) -
                  (ulong)(uVar15 < uVar9 << 0x20);
          if (lVar6 < 0) {
            uVar15 = (0x100000000 - uVar12) * uVar16;
            uVar9 = uVar11;
            do {
              uVar12 = uVar12 - 0x100000000;
              uVar11 = uVar9 + (uVar16 << 0x20);
              bVar18 = uVar15 < uVar9;
              uVar15 = uVar15 + (uVar16 << 0x20);
              lVar6 = lVar6 + uVar4 + (ulong)bVar18;
              uVar9 = uVar11;
            } while (lVar6 < 0);
          }
          uVar11 = uVar11 >> 0x20 | lVar6 << 0x20;
          uVar15 = 0xffffffff;
          if (uVar11 < (uVar16 & 0xffffffff00000000)) {
            uVar15 = uVar11 / uVar4;
          }
          uVar3 = uVar15 | uVar12;
        }
        if (uVar3 * 2 < 9) {
          uVar13 = uVar13 * (uVar3 >> 0x20);
          uVar12 = (uVar3 & 0xffffffff) * uVar4;
          lVar6 = 0;
          uVar11 = uVar12 + uVar13;
          if (CARRY8(uVar12,uVar13)) {
            lVar6 = -0x100000000;
          }
          uVar13 = uVar3 * uVar16;
          uVar12 = -uVar13;
          lVar6 = (((uVar8 - (uVar13 != 0)) - ((uVar11 >> 0x20) + (uVar3 >> 0x20) * uVar4)) + lVar6)
                  - (ulong)(uVar13 < uVar11 << 0x20);
          if (lVar6 < 0) {
            uVar11 = (1 - uVar3) * uVar16;
            uVar8 = uVar12;
            do {
              uVar3 = uVar3 - 1;
              uVar12 = uVar8 + uVar16;
              bVar18 = uVar11 < uVar8;
              uVar11 = uVar11 + uVar16;
              lVar6 = lVar6 + (ulong)bVar18;
              uVar8 = uVar12;
            } while (lVar6 < 0);
          }
          uVar3 = uVar3 | (lVar6 != 0 || uVar12 != 0);
        }
        fVar19 = roundAndPackFloatx80_sparc
                           (status->floatx80_rounding_precision,(flag)((uVar7 & 0xffff) >> 0xf),
                            (uVar17 - uVar14) + (uint)(uVar16 <= uVar10) + 0x3ffe,uVar5,uVar3,status
                           );
        auVar1 = fVar19._0_12_;
      }
      uVar3 = auVar1._0_8_;
      uVar16 = (ulong)auVar1._8_4_;
      goto LAB_009e3121;
    }
  }
LAB_009e310e:
  uVar3 = 0xc000000000000000;
  status->float_exception_flags = status->float_exception_flags | 1;
  uVar16 = CONCAT62((int6)(unaff_RBP >> 0x10),0xffff);
LAB_009e3121:
  fVar19._8_8_ = uVar16 & 0xffffffff;
  fVar19.low = uVar3;
  return fVar19;
}

Assistant:

floatx80 floatx80_div(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;
    uint64_t rem0, rem1, rem2, term0, term1, term2;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    bSign = extractFloatx80Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if ((uint64_t)(aSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        if ( bExp == 0x7FFF ) {
            if ((uint64_t)(bSig << 1)) {
                return propagateFloatx80NaN(a, b, status);
            }
            goto invalid;
        }
        return packFloatx80(zSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return packFloatx80( zSign, 0, 0 );
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
            if ( ( aExp | aSig ) == 0 ) {
 invalid:
                float_raise(float_flag_invalid, status);
                return floatx80_default_nan(status);
            }
            float_raise(float_flag_divbyzero, status);
            return packFloatx80(zSign, floatx80_infinity_high,
                                       floatx80_infinity_low);
        }
        normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( zSign, 0, 0 );
        normalizeFloatx80Subnormal( aSig, &aExp, &aSig );
    }
    zExp = aExp - bExp + 0x3FFE;
    rem1 = 0;
    if ( bSig <= aSig ) {
        shift128Right( aSig, 0, 1, &aSig, &rem1 );
        ++zExp;
    }
    zSig0 = estimateDiv128To64( aSig, rem1, bSig );
    mul64To128( bSig, zSig0, &term0, &term1 );
    sub128( aSig, rem1, term0, term1, &rem0, &rem1 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        add128( rem0, rem1, 0, bSig, &rem0, &rem1 );
    }
    zSig1 = estimateDiv128To64( rem1, 0, bSig );
    if ( (uint64_t) ( zSig1<<1 ) <= 8 ) {
        mul64To128( bSig, zSig1, &term1, &term2 );
        sub128( rem1, 0, term1, term2, &rem1, &rem2 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            add128( rem1, rem2, 0, bSig, &rem1, &rem2 );
        }
        zSig1 |= ( ( rem1 | rem2 ) != 0 );
    }
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                zSign, zExp, zSig0, zSig1, status);
}